

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalGenerator::SetLanguageEnabledMaps(cmGlobalGenerator *this,string *l,cmMakefile *mf)

{
  pointer pcVar1;
  int iVar2;
  const_iterator cVar3;
  string *psVar4;
  mapped_type *pmVar5;
  cmValue cVar6;
  mapped_type *pmVar7;
  mapped_type_conflict2 *pmVar8;
  string *i;
  pointer __k;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  basic_string_view<char,_std::char_traits<char>_> __str;
  int preference;
  string outputExtensionVar;
  string ignoreExts;
  string ignoreExtensionsVar;
  string linkerPrefVar;
  cmList extensionList;
  int local_114;
  string local_110;
  key_type local_f0;
  pointer local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  char *local_b8;
  undefined8 local_b0;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  cmList local_48;
  
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&(this->LanguageToLinkerPreference)._M_t,l);
  if ((_Rb_tree_header *)cVar3._M_node ==
      &(this->LanguageToLinkerPreference)._M_t._M_impl.super__Rb_tree_header) {
    local_f0._M_dataplus._M_p = (pointer)0x6;
    local_f0._M_string_length = 0x8b9254;
    local_f0.field_2._M_allocated_capacity = 0;
    local_d0 = (l->_M_dataplus)._M_p;
    local_f0.field_2._8_8_ = l->_M_string_length;
    local_c8 = 0;
    local_c0 = 0x12;
    local_b8 = "_LINKER_PREFERENCE";
    local_b0 = 0;
    views._M_len = 3;
    views._M_array = (iterator)&local_f0;
    cmCatViews(&local_68,views);
    psVar4 = (string *)cmMakefile::GetDefinition(mf,&local_68);
    local_114 = 0;
    if ((psVar4 != (string *)0x0) && (psVar4->_M_string_length != 0)) {
      if (psVar4 == (string *)0x0) {
        psVar4 = &cmValue::Empty_abi_cxx11_;
      }
      iVar2 = __isoc99_sscanf((psVar4->_M_dataplus)._M_p,"%d",&local_114);
      if (iVar2 != 1) {
        if (*(psVar4->_M_dataplus)._M_p == 'P') {
          local_114 = 100;
        }
        else {
          local_114 = 0;
        }
      }
    }
    if (local_114 < 0) {
      local_f0._M_dataplus._M_p = (pointer)local_68._M_string_length;
      local_f0._M_string_length = (size_type)local_68._M_dataplus._M_p;
      local_f0.field_2._M_allocated_capacity = 0;
      local_f0.field_2._8_8_ = 0x1f;
      local_d0 = " is negative, adjusting it to 0";
      local_c8 = 0;
      views_00._M_len = 2;
      views_00._M_array = (iterator)&local_f0;
      cmCatViews(&local_110,views_00);
      cmSystemTools::Message(&local_110,"Warning");
      local_114 = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
    }
    iVar2 = local_114;
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&this->LanguageToLinkerPreference,l);
    *pmVar5 = iVar2;
    local_f0._M_dataplus._M_p = (pointer)0x6;
    local_f0._M_string_length = 0x8b9254;
    local_f0.field_2._M_allocated_capacity = 0;
    local_d0 = (l->_M_dataplus)._M_p;
    local_f0.field_2._8_8_ = l->_M_string_length;
    local_c8 = 0;
    local_c0 = 0x11;
    local_b8 = "_OUTPUT_EXTENSION";
    local_b0 = 0;
    views_01._M_len = 3;
    views_01._M_array = (iterator)&local_f0;
    cmCatViews(&local_110,views_01);
    cVar6 = cmMakefile::GetDefinition(mf,&local_110);
    if (cVar6.Value != (string *)0x0) {
      pcVar1 = ((cVar6.Value)->_M_dataplus)._M_p;
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,pcVar1,pcVar1 + (cVar6.Value)->_M_string_length);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->LanguageToOutputExtension,l);
      std::__cxx11::string::_M_assign((string *)pmVar7);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->OutputExtensions,&local_f0);
      std::__cxx11::string::_M_assign((string *)pmVar7);
      local_a8._M_dataplus._M_p = (pointer)local_f0._M_string_length;
      local_a8._M_string_length = (size_type)local_f0._M_dataplus._M_p;
      __str._M_str = ".";
      __str._M_len = 1;
      iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        ((basic_string_view<char,_std::char_traits<char>_> *)&local_a8,0,1,__str);
      if (iVar2 == 0) {
        std::__cxx11::string::substr((ulong)&local_a8,(ulong)&local_f0);
        std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this->OutputExtensions,&local_f0);
        std::__cxx11::string::_M_assign((string *)pmVar7);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
    }
    FillExtensionToLanguageMap(this,l,mf);
    local_f0._M_dataplus._M_p = (pointer)0x6;
    local_f0._M_string_length = 0x8b9254;
    local_f0.field_2._M_allocated_capacity = 0;
    local_d0 = (l->_M_dataplus)._M_p;
    local_f0.field_2._8_8_ = l->_M_string_length;
    local_c8 = 0;
    local_c0 = 0x12;
    local_b8 = "_IGNORE_EXTENSIONS";
    local_b0 = 0;
    views_02._M_len = 3;
    views_02._M_array = (iterator)&local_f0;
    cmCatViews(&local_a8,views_02);
    psVar4 = cmMakefile::GetSafeDefinition(mf,&local_a8);
    pcVar1 = (psVar4->_M_dataplus)._M_p;
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,pcVar1,pcVar1 + psVar4->_M_string_length);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,local_f0._M_dataplus._M_p,
               (char *)(local_f0._M_string_length + (long)local_f0._M_dataplus._M_p));
    init._M_len = 1;
    init._M_array = &local_88;
    cmList::cmList(&local_48,init);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if (local_48.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_48.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      __k = local_48.Values.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      do {
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                 ::operator[](&this->IgnoreExtensions,__k);
        *pmVar8 = true;
        __k = __k + 1;
      } while (__k != local_48.Values.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48.Values);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmGlobalGenerator::SetLanguageEnabledMaps(const std::string& l,
                                               cmMakefile* mf)
{
  // use LanguageToLinkerPreference to detect whether this functions has
  // run before
  if (cm::contains(this->LanguageToLinkerPreference, l)) {
    return;
  }

  std::string linkerPrefVar = cmStrCat("CMAKE_", l, "_LINKER_PREFERENCE");
  cmValue linkerPref = mf->GetDefinition(linkerPrefVar);
  int preference = 0;
  if (cmNonempty(linkerPref)) {
    if (sscanf(linkerPref->c_str(), "%d", &preference) != 1) {
      // backward compatibility: before 2.6 LINKER_PREFERENCE
      // was either "None" or "Preferred", and only the first character was
      // tested. So if there is a custom language out there and it is
      // "Preferred", set its preference high
      if ((*linkerPref)[0] == 'P') {
        preference = 100;
      } else {
        preference = 0;
      }
    }
  }

  if (preference < 0) {
    std::string msg =
      cmStrCat(linkerPrefVar, " is negative, adjusting it to 0");
    cmSystemTools::Message(msg, "Warning");
    preference = 0;
  }

  this->LanguageToLinkerPreference[l] = preference;

  std::string outputExtensionVar = cmStrCat("CMAKE_", l, "_OUTPUT_EXTENSION");
  if (cmValue p = mf->GetDefinition(outputExtensionVar)) {
    std::string outputExtension = *p;
    this->LanguageToOutputExtension[l] = outputExtension;
    this->OutputExtensions[outputExtension] = outputExtension;
    if (cmHasPrefix(outputExtension, ".")) {
      outputExtension = outputExtension.substr(1);
      this->OutputExtensions[outputExtension] = outputExtension;
    }
  }

  // The map was originally filled by SetLanguageEnabledFlag, but
  // since then the compiler- and platform-specific files have been
  // loaded which might have added more entries.
  this->FillExtensionToLanguageMap(l, mf);

  std::string ignoreExtensionsVar =
    cmStrCat("CMAKE_", l, "_IGNORE_EXTENSIONS");
  std::string ignoreExts = mf->GetSafeDefinition(ignoreExtensionsVar);
  cmList extensionList{ ignoreExts };
  for (std::string const& i : extensionList) {
    this->IgnoreExtensions[i] = true;
  }
}